

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void pybind11::
     class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<ReadPath_*,_std::vector<ReadPath,_std::allocator<ReadPath>_>_>,___gnu_cxx::__normal_iterator<ReadPath_*,_std::vector<ReadPath,_std::allocator<ReadPath>_>_>,_false,_(pybind11::return_value_policy)6>_>
     ::dealloc(value_and_holder *v_h)

{
  bool bVar1;
  error_scope scope;
  error_scope local_20;
  
  error_scope::error_scope(&local_20);
  bVar1 = detail::value_and_holder::holder_constructed(v_h);
  if (bVar1) {
    std::
    unique_ptr<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<ReadPath_*,_std::vector<ReadPath,_std::allocator<ReadPath>_>_>,___gnu_cxx::__normal_iterator<ReadPath_*,_std::vector<ReadPath,_std::allocator<ReadPath>_>_>,_false,_(pybind11::return_value_policy)6>,_std::default_delete<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<ReadPath_*,_std::vector<ReadPath,_std::allocator<ReadPath>_>_>,___gnu_cxx::__normal_iterator<ReadPath_*,_std::vector<ReadPath,_std::allocator<ReadPath>_>_>,_false,_(pybind11::return_value_policy)6>_>_>
    ::~unique_ptr((unique_ptr<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<ReadPath_*,_std::vector<ReadPath,_std::allocator<ReadPath>_>_>,___gnu_cxx::__normal_iterator<ReadPath_*,_std::vector<ReadPath,_std::allocator<ReadPath>_>_>,_false,_(pybind11::return_value_policy)6>,_std::default_delete<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<ReadPath_*,_std::vector<ReadPath,_std::allocator<ReadPath>_>_>,___gnu_cxx::__normal_iterator<ReadPath_*,_std::vector<ReadPath,_std::allocator<ReadPath>_>_>,_false,_(pybind11::return_value_policy)6>_>_>
                   *)(v_h->vh + 1));
    detail::value_and_holder::set_holder_constructed(v_h,false);
  }
  else {
    operator_delete(*v_h->vh,v_h->type->type_size);
  }
  *v_h->vh = (void *)0x0;
  error_scope::~error_scope(&local_20);
  return;
}

Assistant:

static void dealloc(detail::value_and_holder &v_h) {
        // We could be deallocating because we are cleaning up after a Python exception.
        // If so, the Python error indicator will be set. We need to clear that before
        // running the destructor, in case the destructor code calls more Python.
        // If we don't, the Python API will exit with an exception, and pybind11 will
        // throw error_already_set from the C++ destructor which is forbidden and triggers
        // std::terminate().
        error_scope scope;
        if (v_h.holder_constructed()) {
            v_h.holder<holder_type>().~holder_type();
            v_h.set_holder_constructed(false);
        }
        else {
            detail::call_operator_delete(v_h.value_ptr<type>(),
                v_h.type->type_size,
                v_h.type->type_align
            );
        }
        v_h.value_ptr() = nullptr;
    }